

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

MAPPING_CHANNEL
Internal_BuiltInMappingChannelFromUnsigned
          (uint built_in_mapping_channel_as_unsigned,bool bEnableErrorMessage)

{
  MAPPING_CHANNEL MVar1;
  uint uVar2;
  
  uVar2 = built_in_mapping_channel_as_unsigned + 0xf;
  if ((uVar2 < 0x11) && ((0x1e3ffU >> (uVar2 & 0x1f) & 1) != 0)) {
    MVar1 = *(MAPPING_CHANNEL *)(&DAT_006cee28 + (ulong)uVar2 * 4);
  }
  else {
    MVar1 = tc_channel;
    if (bEnableErrorMessage) {
      MVar1 = tc_channel;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
                 ,0x8b8,"","Invalid built_in_mapping_channel_as_unsigned value.");
    }
  }
  return MVar1;
}

Assistant:

static ON_Texture::MAPPING_CHANNEL Internal_BuiltInMappingChannelFromUnsigned(
  unsigned int built_in_mapping_channel_as_unsigned,
  bool bEnableErrorMessage
  )
{
  switch (built_in_mapping_channel_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::tc_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::default_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::screen_based_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::wcs_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::wcs_box_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_box_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_light_probe_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_spherical_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_cube_map_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_vcross_cube_map_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_hcross_cube_map_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_hemispherical_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_emap_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::srfp_channel);
  //ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::emap_channel);
  }

  if (bEnableErrorMessage)
  {
    ON_ERROR("Invalid built_in_mapping_channel_as_unsigned value.");
  }
  return ON_Texture::MAPPING_CHANNEL::tc_channel;
}